

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O3

void __thiscall
sznet::net::TcpClient::TcpClient
          (TcpClient *this,EventLoop *loop,InetAddress *serverAddr,string *nameArg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  element_type *peVar3;
  ulong __n;
  int iVar4;
  EventLoop *pEVar5;
  Connector *this_00;
  uint uVar6;
  EventLoop *in_R9;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_1010 [16];
  _Manager_type local_1000;
  code *local_ff8;
  char *local_60 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  file._8_8_ = 0x2c;
  file.m_data = (char *)0xd;
  pEVar5 = CheckNotNull<sznet::net::EventLoop>((sznet *)0x12a982,file,0x12a990,(char *)loop,in_R9);
  this->m_loop = pEVar5;
  this_00 = (Connector *)operator_new(0x70);
  Connector::Connector(this_00,loop,serverAddr);
  std::__shared_ptr<sznet::net::Connector,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<sznet::net::Connector,void>
            ((__shared_ptr<sznet::net::Connector,(__gnu_cxx::_Lock_policy)2> *)&this->m_connector,
             this_00);
  paVar1 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (nameArg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar2,pcVar2 + nameArg->_M_string_length);
  *(undefined8 *)((long)&(this->m_connectionCallback).super__Function_base._M_functor + 8) = 0;
  *(code **)&(this->m_connectionCallback).super__Function_base._M_functor =
       defaultConnectionCallback;
  (this->m_connectionCallback)._M_invoker =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&),_void_(*)(const_std::shared_ptr<sznet::net::TcpConnection>_&)>
       ::_M_invoke;
  (this->m_connectionCallback).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&),_void_(*)(const_std::shared_ptr<sznet::net::TcpConnection>_&)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->m_messageCallback).super__Function_base._M_functor + 8) = 0;
  *(code **)&(this->m_messageCallback).super__Function_base._M_functor = defaultMessageCallback;
  (this->m_messageCallback)._M_invoker =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp),_void_(*)(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
       ::_M_invoke;
  (this->m_messageCallback).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp),_void_(*)(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
       ::_M_manager;
  *(undefined8 *)&(this->m_writeCompleteCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_writeCompleteCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_writeCompleteCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_writeCompleteCallback)._M_invoker = (_Invoker_type)0x0;
  this->m_retry = false;
  this->m_connect = true;
  this->m_nextConnId = 1;
  (this->m_mutex).m_holder = 0;
  local_40 = paVar1;
  sz_mutex_init(&(this->m_mutex).m_mutex);
  (this->m_connection).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_connection).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (this->m_connector).super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_1010._8_8_ = 0;
  local_1010._0_8_ = operator_new(0x18);
  *(code **)local_1010._0_8_ = newConnection;
  *(undefined8 *)(local_1010._0_8_ + 8) = 0;
  local_ff8 = std::
              _Function_handler<void_(int),_std::_Bind<void_(sznet::net::TcpClient::*(sznet::net::TcpClient_*,_std::_Placeholder<1>))(int)>_>
              ::_M_invoke;
  *(TcpClient **)(local_1010._0_8_ + 0x10) = this;
  local_1000 = std::
               _Function_handler<void_(int),_std::_Bind<void_(sznet::net::TcpClient::*(sznet::net::TcpClient_*,_std::_Placeholder<1>))(int)>_>
               ::_M_manager;
  std::function<void_(int)>::operator=
            (&peVar3->m_newConnectionCallback,(function<void_(int)> *)local_1010);
  if (local_1000 != (_Manager_type)0x0) {
    (*local_1000)((_Any_data *)local_1010,(_Any_data *)local_1010,__destroy_functor);
  }
  if (g_logLevel < 3) {
    file_00._8_8_ = 0xd;
    file_00.m_data = "TcpClient.cpp";
    local_38 = &this->m_name;
    Logger::Logger((Logger *)local_1010,file_00,0x37);
    iVar4 = (int)local_60;
    uVar6 = iVar4 - (int)local_60[0];
    if (0x15 < uVar6) {
      builtin_strncpy(local_60[0],"TcpClient::TcpClient[",0x15);
      local_60[0] = local_60[0] + 0x15;
      uVar6 = iVar4 - (int)local_60[0];
    }
    __n = (this->m_name)._M_string_length;
    if (__n < (ulong)(long)(int)uVar6) {
      memcpy(local_60[0],(local_38->_M_dataplus)._M_p,__n);
      local_60[0] = local_60[0] + __n;
      uVar6 = iVar4 - (int)local_60[0];
    }
    if (0xe < uVar6) {
      builtin_strncpy(local_60[0],"] - connector ",0xe);
      local_60[0] = local_60[0] + 0xe;
    }
    LogStream::operator<<
              ((LogStream *)(local_1010 + 8),
               (this->m_connector).
               super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    Logger::~Logger((Logger *)local_1010);
  }
  return;
}

Assistant:

TcpClient::TcpClient(EventLoop* loop, const InetAddress& serverAddr, const string& nameArg): 
	m_loop(CHECK_NOTNULL(loop)),
    m_connector(new Connector(loop, serverAddr)),
    m_name(nameArg),
    m_connectionCallback(defaultConnectionCallback),
    m_messageCallback(defaultMessageCallback),
    m_retry(false),
    m_connect(true),
    m_nextConnId(1)
{
	m_connector->setNewConnectionCallback(std::bind(&TcpClient::newConnection, this, std::placeholders::_1));
	// FIXME setConnectFailedCallback
	LOG_INFO << "TcpClient::TcpClient[" << m_name 
		<< "] - connector " << get_pointer(m_connector);
}